

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void rw::syncObjRecurse(Frame *frame)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  ObjectWithFrame *this;
  LLLink *local_20;
  LLLink *lnk;
  LLLink *_next;
  Frame *frame_local;
  
  for (_next = (LLLink *)frame; _next != (LLLink *)0x0; _next = _next[0xb].prev) {
    local_20 = _next[2].next;
    while( true ) {
      pLVar1 = local_20->next;
      pLVar2 = LinkList::end((LinkList *)(_next + 2));
      if (local_20 == pLVar2) break;
      this = ObjectWithFrame::fromFrame(local_20);
      ObjectWithFrame::sync(this);
      local_20 = pLVar1;
    }
    *(byte *)((long)&_next->next + 3) = *(byte *)((long)&_next->next + 3) & 0xf7;
    syncObjRecurse((Frame *)_next[0xb].next);
  }
  return;
}

Assistant:

static void
syncObjRecurse(Frame *frame)
{
	for(; frame; frame = frame->next){
		// Synch attached objects
		FORLIST(lnk, frame->objectList)
			ObjectWithFrame::fromFrame(lnk)->sync();
		frame->object.privateFlags &= ~Frame::SUBTREESYNCOBJ;
		// And synch all children
		syncObjRecurse(frame->child);
	}
}